

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O1

ModelWire * __thiscall
lsim::gui::CircuitEditor::ui_try_merge_wire_segment(CircuitEditor *this,ModelWireSegment *segment)

{
  ModelWire *this_00;
  ModelWire *pMVar1;
  CircuitEditor *pCVar2;
  ModelWireSegment *pMVar3;
  bool bVar4;
  char cVar5;
  ModelWireJunction *pMVar6;
  ModelWire *pMVar7;
  int w;
  long lVar8;
  Point *p;
  ModelWire *pMVar9;
  _Hash_node_base *p_Var10;
  bool bVar11;
  ModelWire *target_wires [2];
  Point end_points [2];
  ModelWire *local_68 [2];
  Point local_58;
  Point local_50 [2];
  CircuitEditor *local_40;
  ModelWireSegment *local_38;
  
  local_68[0] = (ModelWire *)0x0;
  local_68[1] = (ModelWire *)0x0;
  pMVar6 = ModelWireSegment::junction(segment,0);
  local_58 = pMVar6->m_position;
  lVar8 = 1;
  pMVar6 = ModelWireSegment::junction(segment,1);
  local_50[0] = pMVar6->m_position;
  p_Var10 = (this->m_model_circuit->m_wires)._M_h._M_before_begin._M_nxt;
  pMVar7 = local_68[1];
  pMVar9 = local_68[0];
  pCVar2 = this;
  pMVar3 = segment;
  if (p_Var10 != (_Hash_node_base *)0x0) {
    do {
      local_38 = pMVar3;
      local_40 = pCVar2;
      this_00 = (ModelWire *)p_Var10[2]._M_nxt;
      cVar5 = '\x03';
      if (this_00->m_id < segment->m_wire->m_id) {
        if ((pMVar9 == (ModelWire *)0x0) &&
           (bVar4 = ModelWire::point_on_wire(this_00,&local_58), bVar4)) {
          p = &local_58;
          pMVar9 = this_00;
          pMVar1 = pMVar7;
LAB_0015404d:
          pMVar7 = pMVar1;
          ModelWire::split_at_new_junction(this_00,p);
        }
        else if (pMVar7 == (ModelWire *)0x0) {
          p = local_50;
          bVar4 = ModelWire::point_on_wire(this_00,p);
          pMVar1 = this_00;
          if (bVar4) goto LAB_0015404d;
        }
        cVar5 = (pMVar7 != (ModelWire *)0x0 && pMVar9 != (ModelWire *)0x0) * '\x02';
        segment = local_38;
      }
    } while (((cVar5 == '\x03') || (cVar5 == '\0')) &&
            (p_Var10 = p_Var10->_M_nxt, pCVar2 = local_40, pMVar3 = local_38,
            p_Var10 != (_Hash_node_base *)0x0));
    local_68[1] = pMVar7;
    this = local_40;
  }
  local_68[0] = pMVar9;
  pMVar7 = segment->m_wire;
  bVar4 = false;
  do {
    if (local_68[lVar8] != (ModelWire *)0x0) {
      ModelWire::merge(local_68[lVar8],pMVar7);
      ModelCircuit::remove_wire(this->m_model_circuit,pMVar7->m_id);
      pMVar7 = local_68[lVar8];
      bVar4 = true;
    }
    bVar11 = lVar8 != 0;
    lVar8 = lVar8 + -1;
  } while (bVar11);
  if (!bVar4) {
    pMVar7 = segment->m_wire;
  }
  return pMVar7;
}

Assistant:

ModelWire* CircuitEditor::ui_try_merge_wire_segment(ModelWireSegment* segment) {

	ModelWire* target_wires[2] = { nullptr, nullptr };
	Point end_points[2] = { segment->junction(0)->position(), segment->junction(1)->position() };

	for (auto& iter : m_model_circuit->wires()) {
		auto wire = iter.second.get();
		if (wire->id() >= segment->wire()->id()) {
			continue;
		}
			
		if (target_wires[0] == nullptr && wire->point_on_wire(end_points[0])) {
			wire->split_at_new_junction(end_points[0]);
			target_wires[0] = wire;
		} else if (target_wires[1] == nullptr && wire->point_on_wire(end_points[1])) {
			wire->split_at_new_junction(end_points[1]);
			target_wires[1] = wire;
		}

		if (target_wires[0] != nullptr && target_wires[1] != nullptr) {
			break;
		}
	}

	auto wire_to_merge = segment->wire();
	bool merged = false;
	for (int w = 1; w >= 0; --w) {
		if (target_wires[w] != nullptr) {
			target_wires[w]->merge(wire_to_merge);
			m_model_circuit->remove_wire(wire_to_merge->id());
			wire_to_merge = target_wires[w];
			merged = true;
		}
	}

	return (merged) ? wire_to_merge : segment->wire();
}